

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O0

_Bool trans_VCVT_sp(DisasContext_conflict1 *s,arg_VCVT_sp *a)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  TCGv_i32 var;
  TCGv_i64 retval;
  TCGv_i32 vm;
  TCGv_i64 vd;
  TCGContext_conflict1 *tcg_ctx;
  arg_VCVT_sp *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  _Var1 = isar_feature_aa32_fpdp_v2(s->isar);
  if (_Var1) {
    _Var1 = isar_feature_aa32_simd_r32(s->isar);
    if ((_Var1) || ((a->vd & 0x10U) == 0)) {
      _Var1 = vfp_access_check(s);
      if (_Var1) {
        var = tcg_temp_new_i32(tcg_ctx_00);
        retval = tcg_temp_new_i64(tcg_ctx_00);
        neon_load_reg32(tcg_ctx_00,var,a->vm);
        gen_helper_vfp_fcvtds(tcg_ctx_00,retval,var,tcg_ctx_00->cpu_env);
        neon_store_reg64(tcg_ctx_00,retval,a->vd);
        tcg_temp_free_i32(tcg_ctx_00,var);
        tcg_temp_free_i64(tcg_ctx_00,retval);
        s_local._7_1_ = true;
      }
      else {
        s_local._7_1_ = true;
      }
    }
    else {
      s_local._7_1_ = false;
    }
  }
  else {
    s_local._7_1_ = false;
  }
  return s_local._7_1_;
}

Assistant:

static bool trans_VCVT_sp(DisasContext *s, arg_VCVT_sp *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i64 vd;
    TCGv_i32 vm;

    if (!dc_isar_feature(aa32_fpdp_v2, s)) {
        return false;
    }

    /* UNDEF accesses to D16-D31 if they don't exist. */
    if (!dc_isar_feature(aa32_simd_r32, s) && (a->vd & 0x10)) {
        return false;
    }

    if (!vfp_access_check(s)) {
        return true;
    }

    vm = tcg_temp_new_i32(tcg_ctx);
    vd = tcg_temp_new_i64(tcg_ctx);
    neon_load_reg32(tcg_ctx, vm, a->vm);
    gen_helper_vfp_fcvtds(tcg_ctx, vd, vm, tcg_ctx->cpu_env);
    neon_store_reg64(tcg_ctx, vd, a->vd);
    tcg_temp_free_i32(tcg_ctx, vm);
    tcg_temp_free_i64(tcg_ctx, vd);
    return true;
}